

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O1

void __thiscall
sc_core::sc_trace_file_base::set_time_unit(sc_trace_file_base *this,double v,sc_time_unit tu)

{
  ostream *poVar1;
  value_type vVar2;
  ulong uVar3;
  unit_type tu_00;
  stringstream ss;
  string local_1c0;
  double local_1a0;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  if (this->initialized_ == true) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_188,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "\n\tTimescale unit cannot be changed once tracing has begun.\n\tTo change the scale, create a new trace file."
               ,0x69);
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_ERROR,"sc_trace_file already initialized",local_1c0._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0xd3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) goto LAB_00208fe9;
  }
  else {
    this->timescale_set_by_user = true;
    local_1a0 = v;
    vVar2 = unit_to_fs(tu);
    uVar3 = (ulong)((double)(long)vVar2 * local_1a0);
    this->trace_unit_fs =
         (long)((double)(long)vVar2 * local_1a0 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
         uVar3;
    std::__cxx11::stringstream::stringstream(local_198);
    fs_unit_to_str_abi_cxx11_(&local_1c0,(sc_trace_file_base *)this->trace_unit_fs,tu_00);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_188,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->filename_)._M_dataplus._M_p,(this->filename_)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_INFO,"tracing timescale unit set",local_1c0._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0xdf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) goto LAB_00208fe9;
  }
  operator_delete(local_1c0._M_dataplus._M_p);
LAB_00208fe9:
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void
sc_trace_file_base::set_time_unit( double v, sc_time_unit tu )
{
    if( initialized_ )
    {
        std::stringstream ss;
        ss << filename_ << "\n"
           "\tTimescale unit cannot be changed once tracing has begun.\n"
           "\tTo change the scale, create a new trace file.";
        SC_REPORT_ERROR( SC_ID_TRACING_ALREADY_INITIALIZED_
                       , ss.str().c_str() );
        return;
    }

    timescale_set_by_user = true;
    trace_unit_fs = static_cast<unit_type>(v * unit_to_fs(tu));

    // EMIT ADVISORY MESSAGE ABOUT CHANGE IN TIME SCALE:
    {
      std::stringstream ss;
      ss << fs_unit_to_str(trace_unit_fs)
         << " (" << filename_ << ")";
      SC_REPORT_INFO( SC_ID_TRACING_TIMESCALE_UNIT_, ss.str().c_str() );
    }
}